

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O1

int Ver_FormulaParserFindVar(char *pString,Vec_Ptr_t *vNames)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void **ppvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  
  pbVar10 = (byte *)pString;
  if (*pString == '\\') {
    pcVar11 = pString + 1;
    for (; (*pbVar10 & 0xdf) != 0; pbVar10 = pbVar10 + 1) {
    }
  }
  else {
    while( true ) {
      bVar1 = *pbVar10;
      pcVar11 = pString;
      if ((((ulong)bVar1 < 0x40) && ((0x8400134300002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         ((bVar1 - 0x5e < 0x21 && ((0x1c0000001U >> ((ulong)(bVar1 - 0x5e) & 0x3f) & 1) != 0))))
      break;
      pbVar10 = pbVar10 + 1;
    }
  }
  iVar9 = (int)pbVar10 - (int)pcVar11;
  uVar2 = vNames->nSize;
  uVar8 = (ulong)(int)uVar2;
  uVar3 = 0;
  if (1 < (long)uVar8) {
    uVar3 = uVar2 >> 1;
    uVar7 = 1;
    uVar12 = 0;
    do {
      if (uVar8 <= uVar7 - 1) {
LAB_00355b10:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*(int *)(vNames->pArray + (uVar7 - 1)) == iVar9) {
        if (uVar8 <= uVar7) goto LAB_00355b10;
        iVar4 = strncmp(pcVar11,(char *)vNames->pArray[uVar7],(long)iVar9);
        if (iVar4 == 0) {
          return (int)uVar12;
        }
      }
      uVar12 = uVar12 + 1;
      uVar7 = uVar7 + 2;
    } while (uVar3 != uVar12);
  }
  uVar6 = vNames->nCap;
  if (uVar2 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vNames->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNames->pArray,0x80);
      }
      vNames->pArray = ppvVar5;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar6 * 2;
      if (iVar4 <= (int)uVar6) goto LAB_00355a69;
      if (vNames->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNames->pArray,(ulong)uVar6 << 4);
      }
      vNames->pArray = ppvVar5;
    }
    vNames->nCap = iVar4;
  }
LAB_00355a69:
  iVar4 = vNames->nSize;
  uVar6 = iVar4 + 1;
  vNames->nSize = uVar6;
  vNames->pArray[iVar4] = (void *)(long)iVar9;
  uVar2 = vNames->nCap;
  if (uVar6 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vNames->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNames->pArray,0x80);
      }
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_00355ae5;
      if (vNames->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNames->pArray,(ulong)uVar2 << 4);
      }
    }
    vNames->pArray = ppvVar5;
    vNames->nCap = iVar9;
  }
LAB_00355ae5:
  iVar9 = vNames->nSize;
  vNames->nSize = iVar9 + 1;
  vNames->pArray[iVar9] = pcVar11;
  return uVar3;
}

Assistant:

int Ver_FormulaParserFindVar( char * pString, Vec_Ptr_t * vNames )
{
    char * pTemp, * pTemp2;
    int nLength, nLength2, i;
    // start the string
    pTemp = pString;
    // find the end of the string delimited by other characters
    if ( *pTemp == '\\' )
    {
        pString++;
        while ( *pTemp && *pTemp != ' ' )
            pTemp++;
    }
    else
    {
        while ( *pTemp && *pTemp != ' ' && *pTemp != '\t' && *pTemp != '\r' && *pTemp != '\n' && *pTemp != ',' && *pTemp != '}' && 
                *pTemp != VER_PARSE_SYM_OPEN && *pTemp != VER_PARSE_SYM_CLOSE && 
                *pTemp != VER_PARSE_SYM_NEGBEF1 && *pTemp != VER_PARSE_SYM_NEGBEF2 && 
                *pTemp != VER_PARSE_SYM_AND && *pTemp != VER_PARSE_SYM_OR && *pTemp != VER_PARSE_SYM_XOR && 
                *pTemp != VER_PARSE_SYM_MUX1 && *pTemp != VER_PARSE_SYM_MUX2 )
                pTemp++;
    }
    // look for this string in the array
    nLength = pTemp - pString;
    for ( i = 0; i < Vec_PtrSize(vNames)/2; i++ )
    {
        nLength2 = (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*i + 0 );
        if ( nLength2 != nLength )
            continue;
        pTemp2   = (char *)Vec_PtrEntry( vNames, 2*i + 1 );
        if ( strncmp( pString, pTemp2, nLength ) )
            continue;
        return i;
    }
    // could not find - add and return the number
    Vec_PtrPush( vNames, (void *)(ABC_PTRUINT_T)nLength );
    Vec_PtrPush( vNames, pString );
    return i;
}